

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SystemTools.cxx
# Opt level: O3

bool cmsys::SystemTools::GetShortPath(string *path,string *shortPath)

{
  std::__cxx11::string::_M_assign((string *)shortPath);
  return true;
}

Assistant:

bool SystemTools::GetShortPath(const std::string& path, std::string& shortPath)
{
#if defined(_WIN32) && !defined(__CYGWIN__)
  std::string tempPath = path;  // create a buffer

  // if the path passed in has quotes around it, first remove the quotes
  if (!path.empty() && path[0] == '"' && *path.rbegin() == '"')
    {
    tempPath = path.substr(1, path.length()-2);
    }

  std::wstring wtempPath = Encoding::ToWide(tempPath);
  DWORD ret = GetShortPathNameW(wtempPath.c_str(), NULL, 0);
  std::vector<wchar_t> buffer(ret);
  ret = GetShortPathNameW(wtempPath.c_str(),
                          &buffer[0], static_cast<DWORD>(buffer.size()));

  if (ret == 0)
    {
    return false;
    }
  else
    {
    shortPath = Encoding::ToNarrow(&buffer[0]);
    return true;
    }
#else
  shortPath = path;
  return true;
#endif
}